

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::iterate(FunctionalTest20_21 *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  program program;
  program *program_pointers [5];
  program fragment_program;
  program geometry_program;
  program tesselation_evaluation_program;
  program tesselation_control_program;
  undefined1 local_198 [384];
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)program_pointers);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_198);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initSharedContexts(this);
  program.m_context = (this->super_TestCase).m_context;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  program_pointers[0] = &program;
  prepareProgram(this,program_pointers,false);
  bVar2 = testProgram(this,program_pointers,false,iterate::test_cases,10);
  if (!bVar2) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Last error message was caused by monolithic program.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  Utils::program::~program(&program);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_separate_shader_objects");
  if (bVar3) {
    program.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    program_pointers[2] = &tesselation_control_program;
    tesselation_control_program.m_tesselation_control_shader_id = 0;
    tesselation_control_program.m_tesselation_evaluation_shader_id = 0;
    tesselation_control_program.m_vertex_shader_id = 0;
    tesselation_control_program.m_compute_shader_id = 0;
    tesselation_control_program.m_fragment_shader_id = 0;
    tesselation_control_program.m_geometry_shader_id = 0;
    tesselation_control_program.m_program_object_id = 0;
    program_pointers[3] = &tesselation_evaluation_program;
    tesselation_evaluation_program.m_tesselation_control_shader_id = 0;
    tesselation_evaluation_program.m_tesselation_evaluation_shader_id = 0;
    tesselation_evaluation_program.m_vertex_shader_id = 0;
    tesselation_evaluation_program.m_compute_shader_id = 0;
    tesselation_evaluation_program.m_fragment_shader_id = 0;
    tesselation_evaluation_program.m_geometry_shader_id = 0;
    tesselation_evaluation_program.m_program_object_id = 0;
    program_pointers[1] = &geometry_program;
    geometry_program.m_tesselation_control_shader_id = 0;
    geometry_program.m_tesselation_evaluation_shader_id = 0;
    geometry_program.m_vertex_shader_id = 0;
    geometry_program.m_compute_shader_id = 0;
    geometry_program.m_fragment_shader_id = 0;
    geometry_program.m_geometry_shader_id = 0;
    geometry_program.m_program_object_id = 0;
    program_pointers[0] = &fragment_program;
    fragment_program.m_tesselation_control_shader_id = 0;
    fragment_program.m_tesselation_evaluation_shader_id = 0;
    fragment_program.m_vertex_shader_id = 0;
    fragment_program.m_compute_shader_id = 0;
    fragment_program.m_fragment_shader_id = 0;
    fragment_program.m_geometry_shader_id = 0;
    fragment_program.m_program_object_id = 0;
    program_pointers[4] = &program;
    fragment_program.m_context = program.m_context;
    geometry_program.m_context = program.m_context;
    tesselation_evaluation_program.m_context = program.m_context;
    tesselation_control_program.m_context = program.m_context;
    prepareProgram(this,program_pointers,true);
    bVar3 = testProgram(this,program_pointers,true,iterate::test_cases,10);
    if (bVar3) {
      Utils::program::~program(&fragment_program);
      Utils::program::~program(&geometry_program);
      Utils::program::~program(&tesselation_evaluation_program);
      Utils::program::~program(&tesselation_control_program);
      Utils::program::~program(&program);
      goto LAB_00a20bf7;
    }
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Last error message was caused by separable program.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    Utils::program::~program(&fragment_program);
    Utils::program::~program(&geometry_program);
    Utils::program::~program(&tesselation_evaluation_program);
    Utils::program::~program(&tesselation_control_program);
    Utils::program::~program(&program);
  }
  else {
LAB_00a20bf7:
    if (bVar2) {
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00a20ca3;
    }
  }
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00a20ca3:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest20_21::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Test cases, values stored here are used as bit fields */
	static const GLuint test_cases[][m_n_shared_contexts + 1] = {
		{ 0, 1, 2, 3, 4 },		{ 1, 2, 3, 4, 0 },		{ 2, 3, 4, 0, 1 },		{ 3, 4, 0, 1, 2 },
		{ 4, 0, 1, 2, 3 },		{ 27, 28, 29, 30, 31 }, { 28, 29, 30, 31, 27 }, { 29, 30, 31, 27, 28 },
		{ 30, 31, 27, 28, 29 }, { 31, 27, 28, 29, 30 },
	};
	static const GLuint n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Prepare contexts */
	initSharedContexts();

	/* Test result */
	bool result = true;

	/* Program pointers */
	Utils::program* program_pointers[5];

	/* Test monolithic program */
	{
		/* Prepare program */
		Utils::program program(m_context);

		program_pointers[m_fragment_stage_index] = &program;

		prepareProgram(program_pointers, false);

		/* Execute test */
		if (false == testProgram(program_pointers, false, test_cases, n_test_cases))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Last error message was caused by monolithic program."
												<< tcu::TestLog::EndMessage;

			result = false;
		}
	}

	/* Test separable programs */
	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects"))
	{
		/* Prepare programs */
		Utils::program vertex_program(m_context);
		Utils::program tesselation_control_program(m_context);
		Utils::program tesselation_evaluation_program(m_context);
		Utils::program geometry_program(m_context);
		Utils::program fragment_program(m_context);

		program_pointers[m_fragment_stage_index]			   = &fragment_program;
		program_pointers[m_geometry_stage_index]			   = &geometry_program;
		program_pointers[m_tesselation_control_stage_index]	= &tesselation_control_program;
		program_pointers[m_tesselation_evaluation_stage_index] = &tesselation_evaluation_program;
		program_pointers[m_vertex_stage_index]				   = &vertex_program;

		prepareProgram(program_pointers, true);

		/* Execute test */
		if (false == testProgram(program_pointers, true, test_cases, n_test_cases))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Last error message was caused by separable program."
												<< tcu::TestLog::EndMessage;
			result = false;
		}
	}

	/* All done */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return tcu::TestNode::STOP;
}